

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TestCaseTracking::TrackerBase::TrackerBase
          (TrackerBase *this,NameAndLocation *nameAndLocation,TrackerContext *ctx,ITracker *parent)

{
  pointer pcVar1;
  size_t sVar2;
  
  (this->super_ITracker)._vptr_ITracker = (_func_int **)&PTR__ITracker_00182630;
  (this->super_ITracker).m_nameAndLocation.name._M_dataplus._M_p =
       (pointer)&(this->super_ITracker).m_nameAndLocation.name.field_2;
  pcVar1 = (nameAndLocation->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_ITracker).m_nameAndLocation,pcVar1,
             pcVar1 + (nameAndLocation->name)._M_string_length);
  sVar2 = (nameAndLocation->location).line;
  (this->super_ITracker).m_nameAndLocation.location.file = (nameAndLocation->location).file;
  (this->super_ITracker).m_nameAndLocation.location.line = sVar2;
  (this->super_ITracker)._vptr_ITracker = (_func_int **)&PTR__TrackerBase_001826c0;
  this->m_ctx = ctx;
  this->m_parent = parent;
  (this->m_children).
  super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_children).
  super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_children).
           super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_children).
           super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  return;
}

Assistant:

TrackerBase::TrackerBase( NameAndLocation const& nameAndLocation, TrackerContext& ctx, ITracker* parent ):
        ITracker(nameAndLocation),
        m_ctx( ctx ),
        m_parent( parent )
    {}